

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::detail::format_error_code(buffer<char> *out,int error_code,string_view message)

{
  bool bVar1;
  int value;
  type tVar2;
  char (*args_1) [3];
  size_t sVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_RDX;
  uint32_t in_ESI;
  char (*in_RDI) [5];
  buffer_appender<char> it;
  uint32_or_64_or_128_t<int> abs_value;
  size_t error_code_size;
  buffer<char> *in_stack_ffffffffffffff88;
  buffer_appender<char> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint32_t local_2c;
  long lVar4;
  undefined4 in_stack_ffffffffffffffe0;
  uint32_t uVar5;
  
  local_2c = in_ESI;
  buffer<char>::try_resize
            ((buffer<char> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  lVar4 = 8;
  uVar5 = local_2c;
  bVar1 = is_negative<int,_0>(local_2c);
  if (bVar1) {
    local_2c = -local_2c;
    lVar4 = lVar4 + 1;
  }
  value = count_digits(local_2c);
  tVar2 = to_unsigned<int>(value);
  args_1 = (char (*) [3])(lVar4 + (ulong)tVar2);
  buffer_appender<char>::buffer_appender(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar3 = basic_string_view<char>::size((basic_string_view<char> *)&stack0xfffffffffffffff0);
  if (sVar3 <= 500U - (long)args_1) {
    format_to<fmt::v7::detail::buffer_appender<char>,char[5],fmt::v7::basic_string_view<char>&,char_const(&)[3],true>
              ((buffer_appender<char>)in_RDX.container,in_RDI,
               (basic_string_view<char> *)CONCAT44(uVar5,in_stack_ffffffffffffffe0),args_1);
  }
  format_to<fmt::v7::detail::buffer_appender<char>,char[5],char_const(&)[7],int&,true>
            ((buffer_appender<char>)in_RDX.container,in_RDI,
             (char (*) [7])CONCAT44(uVar5,in_stack_ffffffffffffffe0),(int *)args_1);
  return;
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, "{}{}", message, SEP);
  format_to(it, "{}{}", ERROR_STR, error_code);
  assert(out.size() <= inline_buffer_size);
}